

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::CompactMemTable(DBImpl *this)

{
  long lVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  bool bVar4;
  DBImpl *this_00;
  atomic<bool> *in_RDI;
  long in_FS_OFFSET;
  Version *base;
  Status s;
  VersionEdit edit;
  VersionSet *in_stack_fffffffffffffed8;
  undefined5 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee5;
  undefined1 in_stack_fffffffffffffee6;
  VersionEdit *in_stack_ffffffffffffff08;
  DBImpl *in_stack_ffffffffffffff88;
  Mutex *in_stack_ffffffffffffff98;
  Version *in_stack_ffffffffffffffa0;
  VersionSet *in_stack_ffffffffffffffa8;
  MemTable *in_stack_ffffffffffffffb0;
  DBImpl *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  port::Mutex::AssertHeld((Mutex *)in_stack_fffffffffffffed8);
  if (*(long *)(in_RDI + 0x138) == 0) {
    __assert_fail("imm_ != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x223,"void leveldb::DBImpl::CompactMemTable()");
  }
  VersionEdit::VersionEdit(in_stack_ffffffffffffff08);
  this_00 = (DBImpl *)VersionSet::current(in_stack_fffffffffffffed8);
  Version::Ref((Version *)in_stack_fffffffffffffed8);
  WriteLevel0Table(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                   (VersionEdit *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  Version::Unref((Version *)in_stack_fffffffffffffed8);
  uVar2 = Status::ok((Status *)in_stack_fffffffffffffed8);
  if (((bool)uVar2) &&
     (bVar4 = std::atomic<bool>::load(in_RDI,(memory_order)((ulong)this_00 >> 0x20)), bVar4)) {
    Slice::Slice((Slice *)this_00,
                 (char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffee6,
                                                 CONCAT15(in_stack_fffffffffffffee5,
                                                          in_stack_fffffffffffffee0))));
    Slice::Slice((Slice *)in_stack_fffffffffffffed8);
    Status::IOError((Slice *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffee6,
                                                     CONCAT15(in_stack_fffffffffffffee5,
                                                              in_stack_fffffffffffffee0))),
                    (Slice *)in_stack_fffffffffffffed8);
    Status::operator=((Status *)this_00,
                      (Status *)
                      CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffee6,
                                              CONCAT15(in_stack_fffffffffffffee5,
                                                       in_stack_fffffffffffffee0))));
    Status::~Status((Status *)in_stack_fffffffffffffed8);
  }
  uVar3 = Status::ok((Status *)in_stack_fffffffffffffed8);
  if ((bool)uVar3) {
    VersionEdit::SetPrevLogNumber((VersionEdit *)in_stack_fffffffffffffed8,0xd10469);
    VersionEdit::SetLogNumber((VersionEdit *)in_stack_fffffffffffffed8,0xd10481);
    VersionSet::LogAndApply
              (in_stack_ffffffffffffffa8,(VersionEdit *)in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
    Status::operator=((Status *)this_00,
                      (Status *)
                      CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffffee5,
                                                             in_stack_fffffffffffffee0))));
    Status::~Status((Status *)in_stack_fffffffffffffed8);
  }
  bVar4 = Status::ok((Status *)in_stack_fffffffffffffed8);
  if (bVar4) {
    MemTable::Unref((MemTable *)in_stack_fffffffffffffed8);
    *(undefined8 *)(in_RDI + 0x138) = 0;
    std::atomic<bool>::store(in_RDI,SUB81((ulong)this_00 >> 0x38,0),(memory_order)this_00);
    DeleteObsoleteFiles(in_stack_ffffffffffffff88);
  }
  else {
    RecordBackgroundError
              (this_00,(Status *)
                       CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(bVar4,in_stack_fffffffffffffee0))));
  }
  Status::~Status((Status *)in_stack_fffffffffffffed8);
  VersionEdit::~VersionEdit((VersionEdit *)in_stack_fffffffffffffed8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void DBImpl::CompactMemTable() {
  mutex_.AssertHeld();
  assert(imm_ != nullptr);

  // Save the contents of the memtable as a new Table
  VersionEdit edit;
  Version* base = versions_->current();
  base->Ref();
  Status s = WriteLevel0Table(imm_, &edit, base);
  base->Unref();

  if (s.ok() && shutting_down_.load(std::memory_order_acquire)) {
    s = Status::IOError("Deleting DB during memtable compaction");
  }

  // Replace immutable memtable with the generated Table
  if (s.ok()) {
    edit.SetPrevLogNumber(0);
    edit.SetLogNumber(logfile_number_);  // Earlier logs no longer needed
    s = versions_->LogAndApply(&edit, &mutex_);
  }

  if (s.ok()) {
    // Commit to the new state
    imm_->Unref();
    imm_ = nullptr;
    has_imm_.store(false, std::memory_order_release);
    DeleteObsoleteFiles();
  } else {
    RecordBackgroundError(s);
  }
}